

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O0

UBool icu_63::BytesTrie::findUniqueValue(uint8_t *pos,UBool haveUniqueValue,int32_t *uniqueValue)

{
  byte bVar1;
  int32_t iVar2;
  byte *pos_00;
  int32_t value;
  UBool isFinal;
  int32_t node;
  int32_t *uniqueValue_local;
  byte *pbStack_18;
  UBool haveUniqueValue_local;
  uint8_t *pos_local;
  
  uniqueValue_local._7_1_ = haveUniqueValue;
  pbStack_18 = pos;
  while( true ) {
    while( true ) {
      while( true ) {
        pos_00 = pbStack_18 + 1;
        bVar1 = *pbStack_18;
        value = (int32_t)bVar1;
        if (0xf < (uint)value) break;
        if (value == 0) {
          value = (int32_t)*pos_00;
          pos_00 = pbStack_18 + 2;
        }
        pbStack_18 = pos_00;
        pbStack_18 = findUniqueValueFromBranch
                               (pbStack_18,value + 1,uniqueValue_local._7_1_,uniqueValue);
        if (pbStack_18 == (byte *)0x0) {
          return '\0';
        }
        uniqueValue_local._7_1_ = '\x01';
      }
      if (0x1f < (uint)value) break;
      pbStack_18 = pos_00 + (int)(value - 0xf);
    }
    iVar2 = readValue(pos_00,value >> 1);
    if (uniqueValue_local._7_1_ == '\0') {
      *uniqueValue = iVar2;
      uniqueValue_local._7_1_ = '\x01';
    }
    else if (iVar2 != *uniqueValue) {
      return '\0';
    }
    if ((bVar1 & 1) != 0) break;
    pbStack_18 = skipValue(pos_00,value);
  }
  return '\x01';
}

Assistant:

UBool
BytesTrie::findUniqueValue(const uint8_t *pos, UBool haveUniqueValue, int32_t &uniqueValue) {
    for(;;) {
        int32_t node=*pos++;
        if(node<kMinLinearMatch) {
            if(node==0) {
                node=*pos++;
            }
            pos=findUniqueValueFromBranch(pos, node+1, haveUniqueValue, uniqueValue);
            if(pos==NULL) {
                return FALSE;
            }
            haveUniqueValue=TRUE;
        } else if(node<kMinValueLead) {
            // linear-match node
            pos+=node-kMinLinearMatch+1;  // Ignore the match bytes.
        } else {
            UBool isFinal=(UBool)(node&kValueIsFinal);
            int32_t value=readValue(pos, node>>1);
            if(haveUniqueValue) {
                if(value!=uniqueValue) {
                    return FALSE;
                }
            } else {
                uniqueValue=value;
                haveUniqueValue=TRUE;
            }
            if(isFinal) {
                return TRUE;
            }
            pos=skipValue(pos, node);
        }
    }
}